

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::
     conc_heterogeneous_queue_basic_void_tests<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>
               (void)

{
  bool bVar1;
  int local_8c;
  undefined1 local_88 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  undefined1 local_40 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_40);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)local_40);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x48);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_40);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_88);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  clear((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_88);
  local_8c = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_88,&local_8c);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)local_88);
  if (bVar1) {
    detail::assert_failed<>
              ("!queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x50);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  clear((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_88);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)local_88);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x53);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  clear((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_88);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_88);
  return;
}

Assistant:

void conc_heterogeneous_queue_basic_void_tests()
    {
        {
            QUEUE queue;
            DENSITY_TEST_ASSERT(queue.empty());
        }

        {
            QUEUE queue;
            queue.clear();

            queue.push(1);
            DENSITY_TEST_ASSERT(!queue.empty());

            queue.clear();
            DENSITY_TEST_ASSERT(queue.empty());
            queue.clear();
        }
    }